

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmNinjaTargetGenerator::AddFeatureFlags(cmNinjaTargetGenerator *this,string *flags,string *lang)

{
  bool bVar1;
  allocator local_49;
  string local_48;
  
  cmLocalGenerator::AddLanguageFlags
            (&this->LocalGenerator->super_cmLocalGenerator,flags,lang,
             &this->LocalGenerator->ConfigName);
  std::__cxx11::string::string((string *)&local_48,"INTERPROCEDURAL_OPTIMIZATION",&local_49);
  bVar1 = GetFeatureAsBool(this,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (bVar1) {
    cmLocalGenerator::AppendFeatureOptions
              (&this->LocalGenerator->super_cmLocalGenerator,flags,lang,"IPO");
  }
  return;
}

Assistant:

void cmNinjaTargetGenerator::AddFeatureFlags(std::string& flags,
                                             const std::string& lang)
{
  // Add language-specific flags.
  this->LocalGenerator->AddLanguageFlags(flags, lang, this->GetConfigName());

  if(this->GetFeatureAsBool("INTERPROCEDURAL_OPTIMIZATION"))
    {
    this->LocalGenerator->AppendFeatureOptions(flags, lang, "IPO");
    }
}